

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void dfs(int head,int cur,int len,int *path)

{
  long lVar1;
  int *__k;
  int *piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  mapped_type *pmVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  
  vis[cur] = true;
  lVar5 = (long)len;
  path[lVar5 + -1] = cur;
  if (0 < outDegrees[cur]) {
    lVar1 = lVar5 + -1;
    iVar7 = len + 2;
    lVar9 = 0;
    do {
      iVar4 = G[cur][lVar9];
      if ((isValid[iVar4] == head + 100) && (vis[iVar4] == false)) {
        __k = G[cur] + lVar9;
        if (isTail[iVar4] == -100 - head) {
          pmVar6 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)(pre.
                                    super__Vector_base<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + head),__k);
          piVar2 = (pmVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          for (piVar8 = (pmVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start; piVar8 != piVar2; piVar8 = piVar8 + 1) {
            if (vis[*piVar8] == false) {
              path[lVar5] = *__k;
              iVar3 = *piVar8;
              path[lVar5 + 1] = iVar3;
              iVar4 = cycleNum[iVar7];
              if (-1 < len) {
                uVar10 = 0;
                do {
                  iVar3 = sprintf(cycle[lVar1] + iVar4,"%d",(ulong)ids[path[uVar10]]);
                  iVar4 = cycleNum[iVar7];
                  cycleNum[iVar7] = (int)((long)iVar3 + (long)iVar4);
                  cycle[lVar1][(long)iVar3 + (long)iVar4] = ',';
                  iVar4 = cycleNum[iVar7] + 1;
                  cycleNum[iVar7] = iVar4;
                  uVar10 = uVar10 + 1;
                } while (len + 1U != uVar10);
                iVar3 = path[lVar5 + 1];
              }
              iVar3 = sprintf(cycle[lVar1] + iVar4,"%d",(ulong)ids[iVar3]);
              iVar4 = cycleNum[iVar7];
              cycleNum[iVar7] = (int)((long)iVar3 + (long)iVar4);
              cycle[lVar1][(long)iVar3 + (long)iVar4] = '\n';
              cycleNum[iVar7] = cycleNum[iVar7] + 1;
              ansNum = ansNum + 1;
            }
          }
        }
        if (len < 5) {
          dfs(head,*__k,len + 1U,path);
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < outDegrees[cur]);
  }
  vis[cur] = false;
  return;
}

Assistant:

void dfs(int head, int cur, int len, int path[]) {
    vis[cur] = true;
    path[len - 1] = cur;
    for (int i = 0; i < outDegrees[cur]; ++i) {
        int &v = G[cur][i];
        if (isValid[v] != (head + 100) || vis[v])continue;
        if (isTail[v] == (-100 - head)) {
            for (auto &x :pre[head][v]) {
                if (!vis[x]) {
                    path[len] = v;
                    path[len + 1] = x;
                    for (int j = 0; j < len + 1; ++j) {
                        cycleNum[len + 2] += sprintf(cycle[len - 1] + cycleNum[len + 2], "%d", ids[path[j]]);
                        cycle[len - 1][cycleNum[len + 2]] = ',';
                        ++cycleNum[len + 2];
                    }
                    cycleNum[len + 2] += sprintf(cycle[len - 1] + cycleNum[len + 2], "%d", ids[path[len + 1]]);
                    cycle[len - 1][cycleNum[len + 2]] = '\n';
                    ++cycleNum[len + 2];
                    ++ansNum;
                }
            }
        }
        if (len < 5) {
            dfs(head, v, len + 1, path);
        }
    }
    vis[cur] = false;
}